

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
* slang::ast::anon_unknown_0::getInterfacePortInfo(Scope *scope,InterfacePortHeaderSyntax *header)

{
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  byte bVar1;
  Token *pTVar2;
  bool bVar3;
  Compilation *pCVar4;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  long lVar7;
  basic_string_view<char,_std::char_traits<char>_> *__x;
  long in_RDX;
  Diagnostic *in_RSI;
  Compilation *in_RDI;
  string_view sVar8;
  Diagnostic *diag_1;
  const_iterator it;
  Token member;
  Diagnostic *diag;
  DefinitionSymbol *defSym;
  string_view modport;
  Symbol *def;
  Token token;
  Compilation *comp;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation x;
  SourceLocation this;
  SourceLocation in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  DiagCode in_stack_fffffffffffffd14;
  Token *in_stack_fffffffffffffd20;
  Diagnostic *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  Scope *in_stack_fffffffffffffd50;
  Compilation *pCVar9;
  SourceLocation in_stack_fffffffffffffd80;
  SourceLocation in_stack_fffffffffffffd88;
  size_t local_218;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 uVar10;
  SourceLocation in_stack_fffffffffffffe40;
  SourceLocation in_stack_fffffffffffffe48;
  SourceLocation SVar11;
  size_t in_stack_fffffffffffffe50;
  DiagCode DVar12;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  undefined8 local_190;
  string_view local_188;
  SourceRange local_178;
  undefined4 local_168;
  undefined4 local_164;
  SourceRange local_160;
  string_view local_150;
  int *local_140;
  int *local_128;
  undefined8 local_120;
  undefined8 local_118;
  Compilation *local_110;
  long local_108;
  Diagnostic *local_100;
  Token *local_f0;
  long local_e8;
  char_pointer local_e0;
  table_element_pointer local_d8;
  Token *local_d0;
  long local_c8;
  char_pointer local_c0;
  table_element_pointer local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b0;
  Token *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  Token *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Token *local_10;
  long local_8;
  
  DVar12 = SUB84(in_stack_fffffffffffffe50 >> 0x20,0);
  pCVar9 = in_RDI;
  local_108 = in_RDX;
  local_100 = in_RSI;
  pCVar4 = Scope::getCompilation((Scope *)in_RSI);
  local_120 = *(undefined8 *)(local_108 + 0x18);
  local_118 = *(undefined8 *)(local_108 + 0x20);
  local_110 = pCVar4;
  local_150 = parsing::Token::valueText
                        ((Token *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  pDVar5 = local_100;
  local_160 = parsing::Token::range(in_stack_fffffffffffffd20);
  local_164 = 0xce0006;
  sVar8._M_str = (char *)pDVar5;
  sVar8._M_len = (size_t)pCVar4;
  sourceRange.endLoc = in_stack_fffffffffffffd88;
  sourceRange.startLoc = in_stack_fffffffffffffd80;
  x = local_160.startLoc;
  this = local_160.endLoc;
  Compilation::getDefinition
            (in_RDI,sVar8,in_stack_fffffffffffffd50,sourceRange,SUB84((ulong)pCVar9 >> 0x20,0));
  local_128 = local_140;
  if ((local_140 == (int *)0x0) || (*local_140 != 2)) {
    if (local_140 != (int *)0x0) {
      local_168 = 0xce0006;
      local_178 = parsing::Token::range(in_stack_fffffffffffffd20);
      sourceRange_00.endLoc = in_stack_fffffffffffffe48;
      sourceRange_00.startLoc = in_stack_fffffffffffffe40;
      pDVar5 = Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                              ,DVar12,sourceRange_00);
      local_188 = parsing::Token::valueText
                            ((Token *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
      ;
      arg._M_str = (char *)pDVar5;
      arg._M_len = (size_t)local_100;
      Diagnostic::operator<<(in_stack_fffffffffffffd40,arg);
    }
    local_190 = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0);
    std::
    tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::tuple<true,_true>((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)this,(DefinitionSymbol **)x,
                        (basic_string_view<char,_std::char_traits<char>_> *)0x51673b);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe50);
    SVar6 = (SourceLocation)Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x51675a);
    if (*(int *)((long)SVar6 + 0x48) == 1) {
      if (*(long *)(local_108 + 0x28) != 0) {
        sVar8 = parsing::Token::valueText
                          ((Token *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        local_218 = sVar8._M_len;
        lVar7 = (long)SVar6 + 0x280;
        local_f0 = (Token *)&stack0xfffffffffffffe50;
        SVar11 = SVar6;
        local_e8 = lVar7;
        local_d0 = local_f0;
        local_c8 = lVar7;
        local_98 = local_f0;
        local_90 = lVar7;
        local_70 = local_f0;
        local_68 = lVar7;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)this,(basic_string_view<char,_std::char_traits<char>_> *)x);
        pTVar2 = local_70;
        local_18 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)this,(size_t)x);
        local_10 = pTVar2;
        local_20 = local_78;
        local_8 = lVar7;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_18);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)0x516a14);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffd08,(size_t)this);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)0x516a5f);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              __x = (basic_string_view<char,_std::char_traits<char>_> *)
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x516aaf);
              in_stack_fffffffffffffd20 = local_10;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x516adc);
              bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffffd20,__x,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
              DVar12 = SUB84(local_218 >> 0x20,0);
              if (bVar3) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_00516bd0;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar3 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)this,
                             (size_t)x);
          DVar12 = SUB84(local_218 >> 0x20,0);
          if (bVar3) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_b0);
            goto LAB_00516bd0;
          }
          bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)((long)SVar6 + 0x288));
          DVar12 = SUB84(local_218 >> 0x20,0);
        } while (bVar3);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_b0);
LAB_00516bd0:
        local_88 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::make_iterator((locator *)0x516bdd);
        local_c0 = local_88.pc_;
        local_b8 = local_88.p_;
        local_e0 = local_88.pc_;
        local_d8 = local_88.p_;
        boost::unordered::
        unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)0x516c61);
        bVar3 = boost::unordered::detail::foa::operator==
                          ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)this,(table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                    *)x);
        bVar1 = 0;
        if (bVar3) {
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xfffffffffffffe50);
          bVar1 = bVar3 ^ 0xff;
        }
        if ((bVar1 & 1) != 0) {
          parsing::Token::range(in_stack_fffffffffffffd20);
          sourceRange_02.endLoc = SVar11;
          sourceRange_02.startLoc = in_stack_fffffffffffffe40;
          Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         DVar12,sourceRange_02);
          arg_01._M_str = (char *)in_stack_fffffffffffffd50;
          arg_01._M_len = in_stack_fffffffffffffd48;
          Diagnostic::operator<<(in_stack_fffffffffffffd40,arg_01);
          arg_02._M_str = (char *)in_stack_fffffffffffffd50;
          arg_02._M_len = in_stack_fffffffffffffd48;
          Diagnostic::operator<<(in_stack_fffffffffffffd40,arg_02);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffd78);
        }
      }
    }
    else {
      uVar10 = 0xa10006;
      parsing::Token::range(in_stack_fffffffffffffd20);
      sourceRange_01.endLoc = SVar6;
      sourceRange_01.startLoc = in_stack_fffffffffffffe40;
      Scope::addDiag((Scope *)CONCAT44(uVar10,in_stack_fffffffffffffe38),DVar12,sourceRange_01);
      arg_00._M_str = (char *)in_stack_fffffffffffffd50;
      arg_00._M_len = in_stack_fffffffffffffd48;
      Diagnostic::operator<<(local_100,arg_00);
      Diagnostic::addNote((Diagnostic *)this,in_stack_fffffffffffffd14,in_stack_fffffffffffffd08);
    }
    std::
    tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    tuple<const_slang::ast::DefinitionSymbol_*&,_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)this,(DefinitionSymbol **)x,
               (basic_string_view<char,_std::char_traits<char>_> *)0x516dda);
  }
  return (tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *)pCVar9;
}

Assistant:

std::tuple<const DefinitionSymbol*, std::string_view> getInterfacePortInfo(
    const Scope& scope, const InterfacePortHeaderSyntax& header) {

    auto& comp = scope.getCompilation();
    auto token = header.nameOrKeyword;
    auto def = comp.getDefinition(token.valueText(), scope, token.range(), diag::UnknownInterface)
                   .definition;
    if (!def || def->kind != SymbolKind::Definition) {
        // If we got a result then getDefinition didn't error, so do it ourselves.
        if (def)
            scope.addDiag(diag::UnknownInterface, token.range()) << token.valueText();
        return {nullptr, {}};
    }

    std::string_view modport;
    auto defSym = &def->as<DefinitionSymbol>();

    if (defSym->definitionKind != DefinitionKind::Interface) {
        auto& diag = scope.addDiag(diag::PortTypeNotInterfaceOrData, header.nameOrKeyword.range());
        diag << defSym->name;
        diag.addNote(diag::NoteDeclarationHere, defSym->location);
        defSym = nullptr;
    }
    else if (header.modport) {
        auto member = header.modport->member;
        modport = member.valueText();
        if (auto it = defSym->modports.find(modport);
            it == defSym->modports.end() && !modport.empty()) {
            auto& diag = scope.addDiag(diag::NotAModport, member.range());
            diag << modport;
            diag << defSym->name;
            modport = {};
        }
    }

    return {defSym, modport};
}